

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONParser.cpp
# Opt level: O2

Var __thiscall JSON::JSONParser::ParseObject(JSONParser *this)

{
  charcount_t len;
  PropertyId propertyId;
  char16_t *string;
  DynamicType *typeWithoutProperty;
  JsonTypeCacheList *this_00;
  PropertyRecord *this_01;
  DynamicType *pDVar1;
  DynamicTypeHandler *newTypeHandler;
  double dVar2;
  Type TVar3;
  tokens tVar4;
  int iVar5;
  JavascriptArray *pJVar6;
  BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  RecyclableObject *obj;
  Var pvVar7;
  JsonTypeCache **ppJVar8;
  int tk;
  JSONScanner *this_03;
  ulong uVar9;
  bool bVar10;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  PropertyRecord *local_48;
  IRecyclerVisitedObject local_40;
  PropertyRecord *propertyRecord;
  JsonTypeCache *currentCache;
  
  ThreadContext::ProbeStack(this->scriptContext->threadContext,0xc00,this->scriptContext,(PVOID)0x0)
  ;
  tVar4 = (this->m_token).tk;
  if (tVar4 == tkFALSE) {
    pJVar6 = (JavascriptArray *)
             (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).booleanFalse.ptr;
  }
  else if (tVar4 == tkNULL) {
    pJVar6 = (JavascriptArray *)
             (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
  }
  else if (tVar4 == tkTRUE) {
    pJVar6 = (JavascriptArray *)
             (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).booleanTrue.ptr;
  }
  else {
    if (tVar4 != tkLCurly) {
      if (tVar4 == tkSub) {
        tVar4 = JSONScanner::Scan(&this->m_scanner);
        if (tVar4 != tkFltCon) {
          JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ea);
        }
        dVar2 = Token::GetDouble((Token *)this);
        pJVar6 = (JavascriptArray *)Js::JavascriptNumber::ToVarIntCheck(-dVar2,this->scriptContext);
      }
      else {
        if (tVar4 == tkLBrack) {
          uVar9 = 0;
          pJVar6 = Js::JavascriptLibrary::CreateArray
                             ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,0);
          this_03 = &this->m_scanner;
          JSONScanner::Scan(this_03);
          bVar10 = (this->m_token).tk == tkRBrack;
          do {
            if (bVar10) {
LAB_00a37d6d:
              tk = 0x51;
              iVar5 = -0x7ff5e9ec;
              goto LAB_00a38079;
            }
            pvVar7 = ParseObject(this);
            (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(pJVar6,uVar9,pvVar7,0);
            if ((this->m_token).tk != tkComma) goto LAB_00a37d6d;
            uVar9 = (ulong)((int)uVar9 + 1);
            JSONScanner::Scan(this_03);
            bVar10 = false;
          } while ((this->m_token).tk != tkRBrack);
          goto LAB_00a380a0;
        }
        if (tVar4 != tkStrCon) {
          if (tVar4 != tkFltCon) {
            JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ee);
          }
          dVar2 = Token::GetDouble((Token *)this);
          pJVar6 = (JavascriptArray *)Js::JavascriptNumber::ToVarIntCheck(dVar2,this->scriptContext)
          ;
          goto LAB_00a37d63;
        }
        pJVar6 = (JavascriptArray *)
                 Js::JavascriptString::NewCopyBuffer
                           ((this->m_scanner).currentString,(this->m_scanner).currentIndex,
                            this->scriptContext);
      }
      JSONScanner::Scan(&this->m_scanner);
      return pJVar6;
    }
    if ((this->arenaAllocator != (ArenaAllocator *)0x0) &&
       (this->typeCacheList == (JsonTypeCacheList *)0x0)) {
      this_02 = (BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::ArenaAllocator>(0x38,this->arenaAllocator,0x35916e);
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,this->arenaAllocator,8);
      this->typeCacheList = this_02;
    }
    pJVar6 = (JavascriptArray *)
             Js::JavascriptLibrary::CreateObject
                       ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    bVar10 = Js::ConfigFlagsTable::IsEnabled
                       ((ConfigFlagsTable *)&Js::Configuration::Global,autoProxyFlag);
    if (bVar10) {
      obj = Js::JavascriptProxy::AutoProxyWrapper(pJVar6);
      pJVar6 = (JavascriptArray *)Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
    }
    this_03 = &this->m_scanner;
    JSONScanner::Scan(this_03);
    tVar4 = (this->m_token).tk;
    if (tVar4 != tkRCurly) {
      propertyRecord = (PropertyRecord *)0x0;
      local_48 = (PropertyRecord *)0x0;
      info._56_8_ = this_03;
      while (tVar4 == tkStrCon) {
        string = (this->m_scanner).currentString;
        len = (this->m_scanner).currentIndex;
        typeWithoutProperty =
             (DynamicType *)
             (pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
        if (this->arenaAllocator == (ArenaAllocator *)0x0) {
LAB_00a37ed7:
          Js::ScriptContext::GetOrAddPropertyRecord
                    (this->scriptContext,string,len,(PropertyRecord **)&local_40);
          tVar4 = JSONScanner::Scan(this_03);
          if (tVar4 != tkColon) {
LAB_00a38090:
            JSONScanner::ThrowSyntaxError(this_03,-0x7ff5e9ed);
          }
          JSONScanner::Scan(this_03);
          pvVar7 = ParseObject(this);
          local_a0 = (undefined1  [8])0x0;
          info.m_instance = (RecyclableObject *)0x50000ffff;
          info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
          info.functionBody = (FunctionBody *)0x0;
          info.prop = (RecyclableObject *)0x0;
          info.m_propertyIndex = 0;
          info.m_attributes = '\0';
          info.flags = InlineCacheNoFlags;
          info.cacheInfoFlag = 0;
          info.inlineCache = (InlineCache *)0x0;
          info.propertyRecordUsageCache._0_4_ = 0xffffffff;
          info.propertyRecordUsageCache._5_1_ = 1;
          (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
                    (pJVar6,(ulong)*(uint *)(local_40._vptr_IRecyclerVisitedObject + 1),pvVar7,0,
                     local_a0);
          if ((((this->arenaAllocator != (ArenaAllocator *)0x0) &&
               (*(Type *)(local_40._vptr_IRecyclerVisitedObject + 2) == false)) &&
              ((pDVar1 = (DynamicType *)
                         (pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type
                         .ptr, local_a0 == (undefined1  [8])0x0 ||
               ((PropertyIndex)info.m_instance != -1)))) &&
             ((pDVar1->isShared == true &&
              (iVar5 = (*((pDVar1->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])(), iVar5 != 0)
              ))) {
            if (local_48 == (PropertyRecord *)0x0) {
              propertyRecord =
                   (PropertyRecord *)
                   JsonTypeCache::New(this->arenaAllocator,
                                      (PropertyRecord *)local_40._vptr_IRecyclerVisitedObject,
                                      typeWithoutProperty,pDVar1,(PropertyIndex)info.m_instance);
              JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                        ((BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this->typeCacheList,(PropertyRecord **)&local_40,
                         (JsonTypeCache **)&propertyRecord);
            }
            else if (propertyRecord == (PropertyRecord *)0x0) {
              propertyRecord =
                   (PropertyRecord *)
                   JsonTypeCache::New(this->arenaAllocator,
                                      (PropertyRecord *)local_40._vptr_IRecyclerVisitedObject,
                                      typeWithoutProperty,pDVar1,(PropertyIndex)info.m_instance);
              local_48[1].super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = (_func_int **)propertyRecord;
            }
            else {
              (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = local_40._vptr_IRecyclerVisitedObject;
              *(DynamicType **)&propertyRecord->pid = typeWithoutProperty;
              *(DynamicType **)&propertyRecord->isNumeric = pDVar1;
              *(PropertyIndex *)&propertyRecord[1].pid = (PropertyIndex)info.m_instance;
            }
            local_48 = propertyRecord;
            propertyRecord =
                 (PropertyRecord *)
                 propertyRecord[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject;
          }
        }
        else {
          if (local_48 == (PropertyRecord *)0x0) {
            this_00 = this->typeCacheList;
            Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
                      ((HashedCharacterBuffer<char16_t> *)local_a0,string,len);
            this_03 = (JSONScanner *)info._56_8_;
            local_40._vptr_IRecyclerVisitedObject = (_func_int **)0x0;
            ppJVar8 = JsUtil::
                      BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      ::LookupWithKey<Js::HashedCharacterBuffer<char16_t>>
                                ((BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                  *)this_00,(HashedCharacterBuffer<char16_t> *)local_a0,
                                 (JsonTypeCache **)&local_40);
            propertyRecord = (PropertyRecord *)*ppJVar8;
          }
          if ((propertyRecord == (PropertyRecord *)0x0) ||
             (*(DynamicType **)&propertyRecord->pid != typeWithoutProperty)) goto LAB_00a37ed7;
          this_01 = (PropertyRecord *)
                    (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject;
          Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
                    ((WriteBarrierPtr<const_char16_t> *)local_a0,string);
          this_03 = (JSONScanner *)info._56_8_;
          info.m_instance = (RecyclableObject *)CONCAT44(info.m_instance._4_4_,len);
          bVar10 = Js::PropertyRecord::Equals(this_01,(CharacterBuffer<char16_t> *)local_a0);
          if (!bVar10) goto LAB_00a37ed7;
          tVar4 = JSONScanner::Scan(this_03);
          if (tVar4 != tkColon) goto LAB_00a38090;
          JSONScanner::Scan(this_03);
          pDVar1 = *(DynamicType **)&propertyRecord->isNumeric;
          propertyId = *(PropertyId *)
                        ((propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject + 1);
          TVar3 = propertyRecord[1].pid;
          local_48 = propertyRecord;
          propertyRecord =
               (PropertyRecord *)
               propertyRecord[1].super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject;
          newTypeHandler = (pDVar1->typeHandler).ptr;
          Js::DynamicObject::EnsureSlots
                    ((DynamicObject *)pJVar6,((typeWithoutProperty->typeHandler).ptr)->slotCapacity,
                     newTypeHandler->slotCapacity,this->scriptContext,newTypeHandler);
          Js::DynamicObject::ReplaceType((DynamicObject *)pJVar6,pDVar1);
          pvVar7 = ParseObject(this);
          Js::DynamicObject::SetSlot
                    ((DynamicObject *)pJVar6,propertyId,false,(uint)(ushort)TVar3,pvVar7);
        }
        if ((this->m_token).tk != tkComma) {
          tk = 0x53;
          iVar5 = -0x7ff5e9eb;
LAB_00a38079:
          CheckCurrentToken(this,tk,iVar5);
          return pJVar6;
        }
        JSONScanner::Scan(this_03);
        tVar4 = (this->m_token).tk;
      }
LAB_00a380a0:
      JSONScanner::ThrowSyntaxError(this_03,-0x7ff5e9e9);
    }
  }
LAB_00a37d63:
  JSONScanner::Scan(&this->m_scanner);
  return pJVar6;
}

Assistant:

Js::Var JSONParser::ParseObject()
    {
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);

        Js::Var retVal;

        switch (m_token.tk)
        {

        case tkFltCon:
            retVal = Js::JavascriptNumber::ToVarIntCheck(m_token.GetDouble(), scriptContext);
            Scan();
            return retVal;

        case tkStrCon:
            {
                // will auto-null-terminate the string (as length=len+1)
                uint len = m_scanner.GetCurrentStringLen();
                retVal = Js::JavascriptString::NewCopyBuffer(m_scanner.GetCurrentString(), len, scriptContext);
                Scan();
                return retVal;
            }

        case tkTRUE:
            retVal = scriptContext->GetLibrary()->GetTrue();
            Scan();
            return retVal;

        case tkFALSE:
            retVal = scriptContext->GetLibrary()->GetFalse();
            Scan();
            return retVal;

        case tkNULL:
            retVal = scriptContext->GetLibrary()->GetNull();
            Scan();
            return retVal;

        case tkSub:  // unary minus

            if (Scan() == tkFltCon)
            {
                retVal = Js::JavascriptNumber::ToVarIntCheck(-m_token.GetDouble(), scriptContext);
                Scan();
                return retVal;
            }
            else
            {
                m_scanner.ThrowSyntaxError(JSERR_JsonBadNumber);
            }

        case tkLBrack:
            {

                Js::JavascriptArray* arrayObj = scriptContext->GetLibrary()->CreateArray(0);

                //skip '['
                Scan();

                //iterate over the array members, get JSON objects and add them in the pArrayMemberList
                uint k = 0;
                while (true)
                {
                    if(tkRBrack == m_token.tk)
                    {
                        break;
                    }
                    Js::Var value = ParseObject();
                    arrayObj->SetItem(k++, value, Js::PropertyOperation_None);

                    // if next token is not a comma consider the end of the array member list.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                    if(tkRBrack == m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }
                }
                //check and consume the ending ']'
                CheckCurrentToken(tkRBrack, JSERR_JsonNoRbrack);
                return arrayObj;

            }

        case tkLCurly:
            {

                // Parse an object, "{"name1" : ObjMember1, "name2" : ObjMember2, ...} "
                if(IsCaching())
                {
                    if(!typeCacheList)
                    {
                        typeCacheList = Anew(this->arenaAllocator, JsonTypeCacheList, this->arenaAllocator, 8);
                    }
                }

                // first, create the object
                Js::DynamicObject* object = scriptContext->GetLibrary()->CreateObject();
                JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
                {
                    object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
                }
#endif

                //next token after '{'
                Scan();

                //if empty object "{}" return;
                if(tkRCurly == m_token.tk)
                {
                    Scan();
                    return object;
                }
                JsonTypeCache* previousCache = nullptr;
                JsonTypeCache* currentCache = nullptr;
                //parse the list of members
                while(true)
                {
                    // parse a list member:  "name" : ObjMember
                    // and add it to the object.

                    //pick "name"
                    if(tkStrCon != m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }

                    // currentStrLength = length w/o null-termination
                    WCHAR* currentStr = m_scanner.GetCurrentString();
                    uint currentStrLength = m_scanner.GetCurrentStringLen();

                    DynamicType* typeWithoutProperty = object->GetDynamicType();
                    if(IsCaching())
                    {
                        if(!previousCache)
                        {
                            // This is the first property in the list - see if we have an existing cache for it.
                            currentCache = typeCacheList->LookupWithKey(Js::HashedCharacterBuffer<WCHAR>(currentStr, currentStrLength), nullptr);
                        }
                        if(currentCache && currentCache->typeWithoutProperty == typeWithoutProperty &&
                            currentCache->propertyRecord->Equals(JsUtil::CharacterBuffer<WCHAR>(currentStr, currentStrLength)))
                        {
                            //check and consume ":"
                            if(Scan() != tkColon )
                            {
                                m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                            }
                            Scan();

                            // Cache all values from currentCache as there is a chance that ParseObject might change the cache
                            DynamicType* typeWithProperty = currentCache->typeWithProperty;
                            PropertyId propertyId = currentCache->propertyRecord->GetPropertyId();
                            PropertyIndex propertyIndex = currentCache->propertyIndex;
                            previousCache = currentCache;
                            currentCache = currentCache->next;

                            // fast path for type transition and property set
                            object->EnsureSlots(typeWithoutProperty->GetTypeHandler()->GetSlotCapacity(),
                                typeWithProperty->GetTypeHandler()->GetSlotCapacity(), scriptContext, typeWithProperty->GetTypeHandler());
                            object->ReplaceType(typeWithProperty);
                            Js::Var value = ParseObject();
                            object->SetSlot(SetSlotArguments(propertyId, propertyIndex, value));

                            // if the next token is not a comma consider the list of members done.
                            if (tkComma != m_token.tk)
                                break;
                            Scan();
                            continue;
                        }
                    }

                    // slow path
                    Js::PropertyRecord const * propertyRecord;
                    scriptContext->GetOrAddPropertyRecord(currentStr, currentStrLength, &propertyRecord);

                    //check and consume ":"
                    if(Scan() != tkColon )
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                    }
                    Scan();
                    Js::Var value = ParseObject();
                    PropertyValueInfo info;
                    object->SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, &info);

                    DynamicType* typeWithProperty = object->GetDynamicType();
                    if(IsCaching() && !propertyRecord->IsNumeric() && !info.IsNoCache() && typeWithProperty->GetIsShared() && typeWithProperty->GetTypeHandler()->IsPathTypeHandler())
                    {
                        PropertyIndex propertyIndex = info.GetPropertyIndex();

                        if(!previousCache)
                        {
                            // This is the first property in the set add it to the dictionary.
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            typeCacheList->AddNew(propertyRecord, currentCache);
                        }
                        else if(!currentCache)
                        {
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            previousCache->next = currentCache;
                        }
                        else
                        {
                            // cache miss!!
                            currentCache->Update(propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                        }
                        previousCache = currentCache;
                        currentCache = currentCache->next;
                    }

                    // if the next token is not a comma consider the list of members done.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                }

                // check  and consume the ending '}"
                CheckCurrentToken(tkRCurly, JSERR_JsonNoRcurly);
                return object;
            }

        default:
            m_scanner.ThrowSyntaxError(JSERR_JsonSyntax);
        }
    }